

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ma_uint32 *pmVar5;
  size_t sVar6;
  ma_uint64 mVar7;
  ma_uint64 mVar8;
  ma_int32 *pmVar9;
  int iVar10;
  int iVar11;
  ma_uint32 *pmVar12;
  ma_uint32 *pmVar13;
  long lVar14;
  ulong uVar15;
  ma_uint16 mVar16;
  ma_int32 mVar17;
  ulong uVar18;
  ma_uint32 mVar19;
  uint uVar20;
  long lVar21;
  ma_uint64 mVar22;
  ulong uVar23;
  ma_uint8 header [4];
  short local_70;
  byte local_6e;
  short local_6c;
  byte local_6a;
  ma_uint64 local_68;
  ma_uint64 local_60;
  ma_int16 *local_58;
  ma_uint32 *local_50;
  ma_int32 *local_48;
  ma_uint32 *local_40;
  long local_38;
  
  if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
    return 0;
  }
  pmVar13 = &(pWav->ima).cachedFrameCount;
  local_48 = (pWav->ima).cachedFrames;
  mVar22 = 0;
  do {
    mVar19 = (pWav->ima).cachedFrameCount;
    if ((mVar19 == 0) && (mVar19 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar6 = (*pWav->onRead)(pWav->pUserData,&local_70,4);
        if (sVar6 != 4) {
          return mVar22;
        }
        mVar19 = (pWav->fmt).blockAlign - 4;
        (pWav->ima).bytesRemainingInBlock = mVar19;
        if (0x58 < local_6e) {
LAB_00154e56:
          (*pWav->onSeek)(pWav->pUserData,mVar19,ma_dr_wav_seek_origin_current);
          (pWav->ima).bytesRemainingInBlock = 0;
          return mVar22;
        }
        (pWav->ima).predictor[0] = (int)local_70;
        (pWav->ima).stepIndex[0] = (uint)local_6e;
        (pWav->ima).cachedFrames[0xf] = (int)local_70;
      }
      else {
        sVar6 = (*pWav->onRead)(pWav->pUserData,&local_70,8);
        if (sVar6 != 8) {
          return mVar22;
        }
        mVar19 = (pWav->fmt).blockAlign - 8;
        (pWav->ima).bytesRemainingInBlock = mVar19;
        if ((0x58 < local_6e) || (0x58 < local_6a)) goto LAB_00154e56;
        (pWav->ima).predictor[0] = (int)local_70;
        (pWav->ima).stepIndex[0] = (uint)local_6e;
        (pWav->ima).predictor[1] = (int)local_6c;
        (pWav->ima).stepIndex[1] = (uint)local_6a;
        (pWav->ima).cachedFrames[0xe] = (int)local_70;
        (pWav->ima).cachedFrames[0xf] = (int)local_6c;
      }
      (pWav->ima).cachedFrameCount = 1;
      mVar19 = 1;
    }
    if (framesToRead == 0) {
      return mVar22;
    }
    local_60 = framesToRead - mVar19;
    local_68 = mVar19 + mVar22;
    mVar7 = mVar22;
    mVar8 = framesToRead;
    while (mVar19 != 0) {
      uVar23 = pWav->readCursorInPCMFrames;
      if (pWav->totalPCMFrameCount <= uVar23) goto LAB_00154e14;
      if (pBufferOut == (ma_int16 *)0x0) {
        pBufferOut = (ma_int16 *)0x0;
      }
      else {
        mVar16 = pWav->channels;
        if (mVar16 == 0) {
          uVar18 = 0;
        }
        else {
          uVar15 = 0;
          do {
            pBufferOut[uVar15] = (ma_int16)pmVar13[uVar15 - mVar16 * mVar19];
            uVar15 = uVar15 + 1;
            mVar16 = pWav->channels;
            uVar18 = (ulong)mVar16;
          } while (uVar15 < uVar18);
        }
        pBufferOut = pBufferOut + uVar18;
      }
      mVar7 = mVar7 + 1;
      pWav->readCursorInPCMFrames = uVar23 + 1;
      (pWav->ima).cachedFrameCount = mVar19 - 1;
      mVar8 = mVar8 - 1;
      mVar19 = mVar19 - 1;
      if (mVar8 == 0) {
        return framesToRead + mVar22;
      }
    }
    mVar7 = local_68;
    mVar8 = local_60;
    if (((pWav->ima).bytesRemainingInBlock != 0) &&
       ((pWav->ima).cachedFrameCount = 8, pWav->channels != 0)) {
      uVar23 = 0;
      pmVar5 = pmVar13;
      lVar14 = 0x10;
      local_58 = pBufferOut;
      local_50 = pmVar13;
      do {
        lVar21 = lVar14;
        pmVar12 = pmVar5;
        sVar6 = (*pWav->onRead)(pWav->pUserData,&local_70,4);
        if (sVar6 != 4) {
          (pWav->ima).cachedFrameCount = 0;
          return local_68;
        }
        (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
        uVar2 = pWav->channels;
        pmVar9 = local_48 + (ulong)uVar2 + lVar21;
        lVar14 = 0;
        pmVar13 = pmVar12;
        do {
          bVar1 = *(byte *)((long)&local_70 + lVar14);
          uVar20 = bVar1 & 0xf;
          iVar3 = (pWav->ima).stepIndex[uVar23];
          uVar4 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar3];
          iVar10 = ((int)(uVar20 << 0x1d) >> 0x1f & uVar4) +
                   ((int)uVar4 >> 1 & (int)(uVar20 << 0x1e) >> 0x1f) +
                   ((int)uVar4 >> 2 & -(bVar1 & 1)) + ((int)uVar4 >> 3);
          iVar11 = -iVar10;
          if ((byte)uVar20 < 8) {
            iVar11 = iVar10;
          }
          mVar19 = iVar11 + (pWav->ima).predictor[uVar23];
          if (0x7ffe < (int)mVar19) {
            mVar19 = 0x7fff;
          }
          if ((int)mVar19 < -0x7fff) {
            mVar19 = 0xffff8000;
          }
          (pWav->ima).predictor[uVar23] = mVar19;
          mVar17 = iVar3 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[uVar20];
          if (0x57 < mVar17) {
            mVar17 = 0x58;
          }
          if (mVar17 < 1) {
            mVar17 = 0;
          }
          (pWav->ima).stepIndex[uVar23] = mVar17;
          pmVar13[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = mVar19;
          iVar3 = (pWav->ima).stepIndex[uVar23];
          uVar4 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar3];
          iVar10 = ((int)((uint)bVar1 << 0x19) >> 0x1f & uVar4) + ((int)uVar4 >> 3) +
                   ((int)uVar4 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                   ((int)uVar4 >> 1 & (int)((uint)bVar1 << 0x1a) >> 0x1f);
          iVar11 = -iVar10;
          if (-1 < (char)bVar1) {
            iVar11 = iVar10;
          }
          iVar11 = iVar11 + (pWav->ima).predictor[uVar23];
          if (0x7ffe < iVar11) {
            iVar11 = 0x7fff;
          }
          if (iVar11 < -0x7fff) {
            iVar11 = -0x8000;
          }
          (pWav->ima).predictor[uVar23] = iVar11;
          mVar17 = iVar3 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar1 >> 4];
          if (0x57 < mVar17) {
            mVar17 = 0x58;
          }
          if (mVar17 < 1) {
            mVar17 = 0;
          }
          (pWav->ima).stepIndex[uVar23] = mVar17;
          pmVar9[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = iVar11;
          lVar14 = lVar14 + 1;
          pmVar9 = (ma_int32 *)((long)pmVar9 + (ulong)((uint)uVar2 * 8));
          pmVar13 = (ma_uint32 *)((long)pmVar13 + (ulong)((uint)uVar2 * 8));
        } while (lVar14 != 4);
        uVar23 = uVar23 + 1;
        mVar7 = local_68;
        mVar8 = local_60;
        pBufferOut = local_58;
        pmVar5 = pmVar12 + 1;
        pmVar13 = local_50;
        lVar14 = lVar21 + 1;
        local_40 = pmVar12;
        local_38 = lVar21;
      } while (uVar23 < uVar2);
    }
LAB_00154e14:
    framesToRead = mVar8;
    mVar22 = mVar7;
    if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
      return mVar7;
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint32 iChannel;
    static ma_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };
    static ma_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17,
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45,
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118,
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066,
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899,
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767
    };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = (ma_int16)ma_dr_wav_bytes_to_u16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                ma_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable) || header[6] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = ma_dr_wav_bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.predictor[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = ma_dr_wav_clamp(header[6], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->ima.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    ma_uint32 iByte;
                    ma_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;
                    for (iByte = 0; iByte < 4; ++iByte) {
                        ma_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        ma_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);
                        ma_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        ma_int32 predictor = pWav->ima.predictor[iChannel];
                        ma_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;
                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];
                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }
    return totalFramesRead;
}